

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_0::FlushFinishCase::init
          (FlushFinishCase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  deBool dVar5;
  ShaderProgram *pSVar6;
  RenderContext *pRVar7;
  ProgramSources *pPVar8;
  TestLog *log;
  TestError *pTVar9;
  undefined4 extraout_var;
  allocator<char> local_189;
  string local_188;
  ShaderSource local_168;
  allocator<char> local_139;
  string local_138;
  ShaderSource local_118;
  ProgramSources local_f0;
  FlushFinishCase *local_10;
  FlushFinishCase *this_local;
  
  local_10 = this;
  pSVar6 = (ShaderProgram *)operator_new(0xd0);
  pRVar7 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,
             "#version 300 es\nin highp vec4 a_position;\nout highp vec4 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_position;\n}\n"
             ,&local_139);
  glu::VertexSource::VertexSource((VertexSource *)&local_118,&local_138);
  pPVar8 = glu::ProgramSources::operator<<(&local_f0,&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,
             "#version 300 es\nuniform highp int u_numIters;\nin highp vec4 v_coord;\nout mediump vec4 o_color;\nvoid main (void)\n{\n\thighp vec4 color = v_coord;\n\tfor (int i = 0; i < u_numIters; i++)\n\t\tcolor = sin(color);\n\to_color = color;\n}\n"
             ,&local_189);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_168,&local_188);
  pPVar8 = glu::ProgramSources::operator<<(pPVar8,&local_168);
  glu::ShaderProgram::ShaderProgram(pSVar6,pRVar7,pPVar8);
  this->m_program = pSVar6;
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  glu::VertexSource::~VertexSource((VertexSource *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  glu::ProgramSources::~ProgramSources(&local_f0);
  bVar2 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar2) {
    log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::operator<<(log,this->m_program);
    pSVar6 = this->m_program;
    if (pSVar6 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar6);
      operator_delete(pSVar6,0xd0);
    }
    this->m_program = (ShaderProgram *)0x0;
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFlushFinishTests.cpp"
               ,0xd9);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pRVar7 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar3) + 0xb48);
  dVar4 = glu::ShaderProgram::getProgram(this->m_program);
  iVar3 = (*pcVar1)(dVar4,"u_numIters");
  this->m_iterCountLoc = iVar3;
  while( true ) {
    dVar5 = ::deGetFalse();
    if ((dVar5 != 0) || (this->m_iterCountLoc < 0)) break;
    dVar5 = ::deGetFalse();
    if (dVar5 == 0) {
      return 0;
    }
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,(char *)0x0,"m_iterCountLoc >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFlushFinishTests.cpp"
             ,0xdd);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void FlushFinishCase::init (void)
{
	DE_ASSERT(!m_program);

	m_program = new glu::ShaderProgram(m_context.getRenderContext(),
		glu::ProgramSources()
			<< glu::VertexSource(
				"#version 300 es\n"
				"in highp vec4 a_position;\n"
				"out highp vec4 v_coord;\n"
				"void main (void)\n"
				"{\n"
				"	gl_Position = a_position;\n"
				"	v_coord = a_position;\n"
				"}\n")
			<< glu::FragmentSource(
				"#version 300 es\n"
				"uniform highp int u_numIters;\n"
				"in highp vec4 v_coord;\n"
				"out mediump vec4 o_color;\n"
				"void main (void)\n"
				"{\n"
				"	highp vec4 color = v_coord;\n"
				"	for (int i = 0; i < u_numIters; i++)\n"
				"		color = sin(color);\n"
				"	o_color = color;\n"
				"}\n"));

	if (!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;
		delete m_program;
		m_program = DE_NULL;
		TCU_FAIL("Compile failed");
	}

	m_iterCountLoc = m_context.getRenderContext().getFunctions().getUniformLocation(m_program->getProgram(), "u_numIters");
	TCU_CHECK(m_iterCountLoc >= 0);
}